

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

Builder * arangodb::velocypack::Collection::sort
                    (Builder *__return_storage_ptr__,Slice array,
                    function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>
                    *lessthan)

{
  pointer pSVar1;
  ValueLength __n;
  Exception *this;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> *__range1;
  Slice *pSVar2;
  ValueLength i;
  ValueLength index;
  Slice *s;
  pointer pSVar3;
  vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_> subValues;
  Slice array_local;
  Slice local_58;
  function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> local_50;
  
  array_local = array;
  if (SliceStaticData::TypeMap[*array._start] == Array) {
    subValues.
    super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subValues.
    super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subValues.
    super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     &array_local);
    std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::reserve
              (&subValues,__n);
    for (index = 0;
        pSVar3 = subValues.
                 super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pSVar1 = subValues.
                 super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                 ._M_impl.super__Vector_impl_data._M_start, __n != index; index = index + 1) {
      local_58 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::at
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            &array_local,index);
      std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::
      emplace_back<arangodb::velocypack::Slice>(&subValues,&local_58);
    }
    std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::function
              (&local_50,lessthan);
    std::
    sort<__gnu_cxx::__normal_iterator<arangodb::velocypack::Slice*,std::vector<arangodb::velocypack::Slice,std::allocator<arangodb::velocypack::Slice>>>,std::function<bool(arangodb::velocypack::Slice,arangodb::velocypack::Slice)>>
              ((__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                )pSVar1,(__normal_iterator<arangodb::velocypack::Slice_*,_std::vector<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>_>
                         )pSVar3,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    Builder::Builder(__return_storage_ptr__);
    pSVar2 = (Slice *)0x6;
    Builder::openCompoundValue(__return_storage_ptr__,'\x06');
    pSVar1 = subValues.
             super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar3 = subValues.
                  super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1)
    {
      pSVar2 = pSVar3;
      Builder::addInternal<arangodb::velocypack::Slice>(__return_storage_ptr__,pSVar3);
    }
    Builder::close(__return_storage_ptr__,(int)pSVar2);
    std::_Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>::
    ~_Vector_base(&subValues.
                   super__Vector_base<arangodb::velocypack::Slice,_std::allocator<arangodb::velocypack::Slice>_>
                 );
    return __return_storage_ptr__;
  }
  this = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this,InvalidValueType,"Expecting type Array");
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder Collection::sort(
    Slice array,
    std::function<bool(Slice, Slice)> lessthan) {
  if (!array.isArray()) {
    throw Exception(Exception::InvalidValueType, "Expecting type Array");
  }
  std::vector<Slice> subValues;
  ValueLength len = array.length();
  subValues.reserve(checkOverflow(len));
  for (ValueLength i = 0; i < len; i++) {
    subValues.push_back(array[i]);
  }
  std::sort(subValues.begin(), subValues.end(), lessthan);
  Builder b;
  b.openArray();
  for (auto const& s : subValues) {
    b.add(s);
  }
  b.close();
  return b;
}